

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t1.c
# Opt level: O1

void opj_t1_clbl_decode_processor(void *user_data,opj_tls_t *tls)

{
  OPJ_UINT32 *pOVar1;
  int *piVar2;
  float fVar3;
  byte bVar4;
  int iVar5;
  long *plVar6;
  int *piVar7;
  opj_event_mgr_t *p_event_mgr;
  opj_mutex_t *mutex;
  opj_mqc_state_t *poVar8;
  OPJ_BYTE *pOVar9;
  byte *pbVar10;
  float *pfVar11;
  bool bVar12;
  OPJ_BOOL OVar13;
  int iVar14;
  void *__s;
  opj_t1_t *t1;
  OPJ_BYTE *pOVar15;
  uint *puVar16;
  uint *puVar17;
  float *pfVar18;
  byte bVar19;
  uint uVar20;
  uint uVar21;
  float fVar22;
  long lVar23;
  long lVar24;
  uint uVar25;
  uint uVar26;
  uint uVar27;
  ulong uVar28;
  OPJ_UINT32 OVar29;
  opj_flag_t *flagsp;
  ulong uVar30;
  uint uVar31;
  float fVar32;
  uint uVar33;
  opj_mqc_state_t **ppoVar34;
  long lVar35;
  int iVar36;
  OPJ_UINT32 OVar37;
  int iVar38;
  uint uVar39;
  uint uVar40;
  uint uVar41;
  long lVar42;
  uint uVar43;
  uint *puVar44;
  ulong uVar45;
  ulong uVar46;
  uint uVar47;
  opj_mqc_t *mqc;
  size_t size;
  uint uVar48;
  uint uVar49;
  uint *puVar50;
  OPJ_INT32 *datap;
  bool bVar51;
  bool bVar52;
  bool bVar53;
  uint local_ec;
  uint local_b4;
  OPJ_INT32 *local_68;
  
  plVar6 = *(long **)((long)user_data + 8);
  if (*user_data == 0) {
    size = (ulong)(uint)(*(int *)((long)plVar6 + 0x1c) - *(int *)((long)plVar6 + 0x14)) *
           (ulong)(uint)((int)plVar6[3] - (int)plVar6[2]) * 4;
    __s = opj_aligned_malloc(size);
    plVar6[8] = (long)__s;
    if (__s != (void *)0x0) {
      memset(__s,0,size);
      goto LAB_00125036;
    }
    if (*(opj_mutex_t **)((long)user_data + 0x40) != (opj_mutex_t *)0x0) {
      opj_mutex_lock(*(opj_mutex_t **)((long)user_data + 0x40));
    }
    opj_event_msg(*(opj_event_mgr_t **)((long)user_data + 0x38),1,
                  "Cannot allocate cblk->decoded_data\n");
    if (*(opj_mutex_t **)((long)user_data + 0x40) != (opj_mutex_t *)0x0) {
      opj_mutex_unlock(*(opj_mutex_t **)((long)user_data + 0x40));
    }
    goto LAB_00125364;
  }
  if ((void *)plVar6[8] != (void *)0x0) {
    opj_aligned_free((void *)plVar6[8]);
    plVar6[8] = 0;
  }
LAB_00125036:
  iVar5 = *(int *)((long)user_data + 4);
  piVar7 = *(int **)((long)user_data + 0x10);
  lVar24 = *(long *)((long)user_data + 0x18);
  lVar35 = *(long *)((long)user_data + 0x20);
  lVar23 = (ulong)(*(int *)(lVar24 + 0x18) - 1) * 0xc0;
  uVar33 = *(int *)(*(long *)(lVar24 + 0x20) + 8 + lVar23) -
           *(int *)(*(long *)(lVar24 + 0x20) + lVar23);
  if (**(int **)((long)user_data + 0x30) == 0) goto LAB_00125372;
  t1 = (opj_t1_t *)opj_tls_get(tls,0);
  if (t1 == (opj_t1_t *)0x0) {
    t1 = (opj_t1_t *)opj_calloc(1,0x118);
    if (t1 == (opj_t1_t *)0x0) {
      t1 = (opj_t1_t *)0x0;
    }
    else {
      t1->encoder = 0;
    }
    opj_tls_set(tls,0,t1,opj_t1_destroy_wrapper);
  }
  t1->mustuse_cblkdatabuffer = *(OPJ_BOOL *)((long)user_data + 0x28);
  iVar36 = *(int *)(lVar35 + 0x328);
  uVar27 = *(uint *)(lVar35 + 0x10);
  p_event_mgr = *(opj_event_mgr_t **)((long)user_data + 0x38);
  mutex = *(opj_mutex_t **)((long)user_data + 0x40);
  iVar38 = *(int *)((long)user_data + 0x48);
  (t1->mqc).lut_ctxno_zc_orient = "" + (uint)(piVar7[4] << 9);
  OVar13 = opj_t1_allocate_buffers
                     (t1,(int)plVar6[3] - (int)plVar6[2],
                      *(int *)((long)plVar6 + 0x1c) - *(int *)((long)plVar6 + 0x14));
  if (OVar13 != 0) {
    local_ec = iVar36 + (int)plVar6[4];
    if ((int)local_ec < 0x1f) {
      opj_mqc_resetstates(&t1->mqc);
      uVar48 = 0;
      opj_mqc_setstate(&t1->mqc,0x12,0,0x2e);
      opj_mqc_setstate(&t1->mqc,0x11,0,3);
      opj_mqc_setstate(&t1->mqc,0,0,4);
      uVar46 = (ulong)*(uint *)(plVar6 + 7);
      if ((uVar46 < 2) && (t1->mustuse_cblkdatabuffer == 0)) {
        if (*(uint *)(plVar6 + 7) == 1) {
          pOVar15 = *(OPJ_BYTE **)plVar6[1];
          goto LAB_00125343;
        }
      }
      else {
        if (uVar46 != 0) {
          lVar23 = 0;
          uVar48 = 0;
          do {
            uVar48 = uVar48 + *(int *)(plVar6[1] + 8 + lVar23);
            lVar23 = lVar23 + 0x10;
          } while (uVar46 << 4 != lVar23);
        }
        uVar26 = uVar48 + 2;
        if (t1->cblkdatabuffersize < uVar26) {
          pOVar15 = (OPJ_BYTE *)opj_realloc(t1->cblkdatabuffer,(ulong)uVar26);
          if (pOVar15 != (OPJ_BYTE *)0x0) {
            t1->cblkdatabuffer = pOVar15;
            (pOVar15 + uVar48)[0] = '\0';
            (pOVar15 + uVar48)[1] = '\0';
            t1->cblkdatabuffersize = uVar26;
            goto LAB_001252a6;
          }
          pOVar15 = (OPJ_BYTE *)0x0;
          bVar12 = false;
        }
        else {
LAB_001252a6:
          pOVar15 = t1->cblkdatabuffer;
          bVar12 = true;
          if ((int)plVar6[7] != 0) {
            uVar46 = 0;
            lVar23 = 8;
            uVar48 = 0;
            do {
              memcpy(pOVar15 + uVar48,*(void **)(plVar6[1] + -8 + lVar23),
                     (ulong)*(uint *)(plVar6[1] + lVar23));
              uVar48 = uVar48 + *(int *)(plVar6[1] + lVar23);
              uVar46 = uVar46 + 1;
              lVar23 = lVar23 + 0x10;
            } while (uVar46 < *(uint *)(plVar6 + 7));
            bVar12 = true;
          }
        }
        if (!bVar12) goto LAB_00125364;
LAB_00125343:
        if ((OPJ_INT32 *)plVar6[8] == (OPJ_INT32 *)0x0) {
          local_68 = (OPJ_INT32 *)0x0;
        }
        else {
          local_68 = t1->data;
          t1->data = (OPJ_INT32 *)plVar6[8];
        }
        if ((int)plVar6[6] != 0) {
          uVar48 = 2;
          uVar46 = 0;
          local_b4 = 0;
          do {
            bVar53 = (uVar27 & 1) == 0;
            lVar23 = *plVar6;
            bVar12 = (int)plVar6[4] + -4 < (int)local_ec;
            bVar51 = 1 < uVar48;
            OVar29 = *(OPJ_UINT32 *)(lVar23 + uVar46 * 0x18);
            if ((bVar51 || bVar53) || bVar12) {
              opj_mqc_init_dec(&t1->mqc,pOVar15 + local_b4,OVar29,2);
            }
            else {
              opj_mqc_raw_init_dec(&t1->mqc,pOVar15 + local_b4,OVar29,2);
            }
            piVar2 = (int *)(lVar23 + uVar46 * 0x18);
            local_b4 = local_b4 + *piVar2;
            if ((0 < (int)local_ec) && (piVar2[2] != 0)) {
              uVar26 = 0;
              do {
                if (uVar48 == 2) {
                  opj_t1_dec_clnpass(t1,local_ec,uVar27);
                }
                else {
                  bVar19 = (byte)local_ec;
                  if (uVar48 == 1) {
                    if ((bVar51 || bVar53) || bVar12) {
                      uVar31 = t1->w;
                      uVar45 = (ulong)uVar31;
                      if ((uVar45 == 0x40) && (t1->h == 0x40)) {
                        puVar16 = (uint *)t1->data;
                        puVar17 = t1->flags + 0x43;
                        ppoVar34 = (t1->mqc).curctx;
                        uVar45 = (ulong)(t1->mqc).c;
                        uVar31 = (t1->mqc).a;
                        OVar29 = (t1->mqc).ct;
                        uVar25 = (uint)(1 << (bVar19 & 0x1f)) >> 1;
                        uVar20 = -uVar25;
                        uVar41 = 0;
                        do {
                          iVar36 = 0;
                          do {
                            puVar50 = puVar17;
                            puVar44 = puVar16;
                            uVar43 = *puVar50;
                            if (uVar43 != 0) {
                              if ((uVar43 & 0x200010) == 0x10) {
                                uVar39 = 0xf - ((uVar43 & 0x1ef) == 0);
                                if ((uVar43 >> 0x14 & 1) != 0) {
                                  uVar39 = 0x10;
                                }
                                ppoVar34 = (t1->mqc).ctxs + uVar39;
                                poVar8 = *ppoVar34;
                                uVar39 = poVar8->qeval;
                                uVar31 = uVar31 - uVar39;
                                if ((uint)(uVar45 >> 0x10) < uVar39) {
                                  uVar49 = (uint)(poVar8->mps == 0);
                                  if (uVar39 > uVar31) {
                                    uVar49 = poVar8->mps;
                                  }
                                  *ppoVar34 = (&poVar8->nmps)[uVar39 <= uVar31];
                                  uVar31 = uVar39;
                                  do {
                                    iVar14 = (int)uVar45;
                                    if (OVar29 == 0) {
                                      pOVar9 = (t1->mqc).bp;
                                      bVar19 = pOVar9[1];
                                      if (*pOVar9 == 0xff) {
                                        if (bVar19 < 0x90) {
                                          (t1->mqc).bp = pOVar9 + 1;
                                          iVar14 = iVar14 + (uint)bVar19 * 0x200;
                                          OVar29 = 7;
                                          goto LAB_001255d2;
                                        }
                                        iVar14 = iVar14 + 0xff00;
                                        pOVar1 = &(t1->mqc).end_of_byte_stream_counter;
                                        *pOVar1 = *pOVar1 + 1;
                                      }
                                      else {
                                        (t1->mqc).bp = pOVar9 + 1;
                                        iVar14 = iVar14 + (uint)bVar19 * 0x100;
                                      }
                                      OVar29 = 8;
                                    }
LAB_001255d2:
                                    uVar31 = uVar31 * 2;
                                    uVar45 = (ulong)(uint)(iVar14 * 2);
                                    OVar29 = OVar29 - 1;
                                  } while (uVar31 < 0x8000);
                                }
                                else {
                                  uVar45 = (ulong)((int)uVar45 + uVar39 * -0x10000);
                                  if ((short)uVar31 < 0) {
                                    uVar49 = poVar8->mps;
                                  }
                                  else {
                                    uVar49 = (uint)(poVar8->mps == 0);
                                    if (uVar31 >= uVar39) {
                                      uVar49 = poVar8->mps;
                                    }
                                    *ppoVar34 = (&poVar8->nmps)[uVar31 < uVar39];
                                    do {
                                      iVar14 = (int)uVar45;
                                      if (OVar29 == 0) {
                                        pOVar9 = (t1->mqc).bp;
                                        bVar19 = pOVar9[1];
                                        if (*pOVar9 == 0xff) {
                                          if (bVar19 < 0x90) {
                                            (t1->mqc).bp = pOVar9 + 1;
                                            iVar14 = iVar14 + (uint)bVar19 * 0x200;
                                            OVar29 = 7;
                                            goto LAB_00125659;
                                          }
                                          iVar14 = iVar14 + 0xff00;
                                          pOVar1 = &(t1->mqc).end_of_byte_stream_counter;
                                          *pOVar1 = *pOVar1 + 1;
                                        }
                                        else {
                                          (t1->mqc).bp = pOVar9 + 1;
                                          iVar14 = iVar14 + (uint)bVar19 * 0x100;
                                        }
                                        OVar29 = 8;
                                      }
LAB_00125659:
                                      uVar31 = uVar31 * 2;
                                      uVar45 = (ulong)(uint)(iVar14 * 2);
                                      OVar29 = OVar29 - 1;
                                    } while (uVar31 < 0x8000);
                                  }
                                }
                                uVar39 = uVar25;
                                if (uVar49 == *puVar44 >> 0x1f) {
                                  uVar39 = uVar20;
                                }
                                *puVar44 = uVar39 + *puVar44;
                                uVar43 = uVar43 | 0x100000;
                              }
                              if ((uVar43 & 0x1000080) == 0x80) {
                                uVar28 = (ulong)(0xf - ((uVar43 & 0xf78) == 0));
                                if ((uVar43 >> 0x17 & 1) != 0) {
                                  uVar28 = 0x10;
                                }
                                ppoVar34 = (t1->mqc).ctxs + uVar28;
                                poVar8 = *ppoVar34;
                                uVar39 = poVar8->qeval;
                                uVar31 = uVar31 - uVar39;
                                if ((uint)(uVar45 >> 0x10) < uVar39) {
                                  uVar49 = (uint)(poVar8->mps == 0);
                                  if (uVar39 > uVar31) {
                                    uVar49 = poVar8->mps;
                                  }
                                  *ppoVar34 = (&poVar8->nmps)[uVar39 <= uVar31];
                                  uVar31 = uVar39;
                                  do {
                                    iVar14 = (int)uVar45;
                                    if (OVar29 == 0) {
                                      pOVar9 = (t1->mqc).bp;
                                      bVar19 = pOVar9[1];
                                      if (*pOVar9 == 0xff) {
                                        if (bVar19 < 0x90) {
                                          (t1->mqc).bp = pOVar9 + 1;
                                          iVar14 = iVar14 + (uint)bVar19 * 0x200;
                                          OVar29 = 7;
                                          goto LAB_00125748;
                                        }
                                        iVar14 = iVar14 + 0xff00;
                                        pOVar1 = &(t1->mqc).end_of_byte_stream_counter;
                                        *pOVar1 = *pOVar1 + 1;
                                      }
                                      else {
                                        (t1->mqc).bp = pOVar9 + 1;
                                        iVar14 = iVar14 + (uint)bVar19 * 0x100;
                                      }
                                      OVar29 = 8;
                                    }
LAB_00125748:
                                    uVar31 = uVar31 * 2;
                                    uVar45 = (ulong)(uint)(iVar14 * 2);
                                    OVar29 = OVar29 - 1;
                                  } while (uVar31 < 0x8000);
                                }
                                else {
                                  uVar45 = (ulong)((int)uVar45 + uVar39 * -0x10000);
                                  if ((short)uVar31 < 0) {
                                    uVar49 = poVar8->mps;
                                  }
                                  else {
                                    uVar49 = (uint)(poVar8->mps == 0);
                                    if (uVar31 >= uVar39) {
                                      uVar49 = poVar8->mps;
                                    }
                                    *ppoVar34 = (&poVar8->nmps)[uVar31 < uVar39];
                                    do {
                                      iVar14 = (int)uVar45;
                                      if (OVar29 == 0) {
                                        pOVar9 = (t1->mqc).bp;
                                        bVar19 = pOVar9[1];
                                        if (*pOVar9 == 0xff) {
                                          if (bVar19 < 0x90) {
                                            (t1->mqc).bp = pOVar9 + 1;
                                            iVar14 = iVar14 + (uint)bVar19 * 0x200;
                                            OVar29 = 7;
                                            goto LAB_001257cf;
                                          }
                                          iVar14 = iVar14 + 0xff00;
                                          pOVar1 = &(t1->mqc).end_of_byte_stream_counter;
                                          *pOVar1 = *pOVar1 + 1;
                                        }
                                        else {
                                          (t1->mqc).bp = pOVar9 + 1;
                                          iVar14 = iVar14 + (uint)bVar19 * 0x100;
                                        }
                                        OVar29 = 8;
                                      }
LAB_001257cf:
                                      uVar31 = uVar31 * 2;
                                      uVar45 = (ulong)(uint)(iVar14 * 2);
                                      OVar29 = OVar29 - 1;
                                    } while (uVar31 < 0x8000);
                                  }
                                }
                                uVar39 = uVar25;
                                if (uVar49 == puVar44[0x40] >> 0x1f) {
                                  uVar39 = uVar20;
                                }
                                puVar44[0x40] = uVar39 + puVar44[0x40];
                                uVar43 = uVar43 | 0x800000;
                              }
                              if ((uVar43 & 0x8000400) == 0x400) {
                                uVar28 = (ulong)(0xf - ((uVar43 & 0x7bc0) == 0));
                                if ((uVar43 >> 0x1a & 1) != 0) {
                                  uVar28 = 0x10;
                                }
                                ppoVar34 = (t1->mqc).ctxs + uVar28;
                                poVar8 = *ppoVar34;
                                uVar39 = poVar8->qeval;
                                uVar31 = uVar31 - uVar39;
                                if ((uint)(uVar45 >> 0x10) < uVar39) {
                                  uVar49 = (uint)(poVar8->mps == 0);
                                  if (uVar39 > uVar31) {
                                    uVar49 = poVar8->mps;
                                  }
                                  *ppoVar34 = (&poVar8->nmps)[uVar39 <= uVar31];
                                  uVar31 = uVar39;
                                  do {
                                    iVar14 = (int)uVar45;
                                    if (OVar29 == 0) {
                                      pOVar9 = (t1->mqc).bp;
                                      bVar19 = pOVar9[1];
                                      if (*pOVar9 == 0xff) {
                                        if (bVar19 < 0x90) {
                                          (t1->mqc).bp = pOVar9 + 1;
                                          iVar14 = iVar14 + (uint)bVar19 * 0x200;
                                          OVar29 = 7;
                                          goto LAB_001258c6;
                                        }
                                        iVar14 = iVar14 + 0xff00;
                                        pOVar1 = &(t1->mqc).end_of_byte_stream_counter;
                                        *pOVar1 = *pOVar1 + 1;
                                      }
                                      else {
                                        (t1->mqc).bp = pOVar9 + 1;
                                        iVar14 = iVar14 + (uint)bVar19 * 0x100;
                                      }
                                      OVar29 = 8;
                                    }
LAB_001258c6:
                                    uVar31 = uVar31 * 2;
                                    uVar45 = (ulong)(uint)(iVar14 * 2);
                                    OVar29 = OVar29 - 1;
                                  } while (uVar31 < 0x8000);
                                }
                                else {
                                  uVar45 = (ulong)((int)uVar45 + uVar39 * -0x10000);
                                  if ((short)uVar31 < 0) {
                                    uVar49 = poVar8->mps;
                                  }
                                  else {
                                    uVar49 = (uint)(poVar8->mps == 0);
                                    if (uVar31 >= uVar39) {
                                      uVar49 = poVar8->mps;
                                    }
                                    *ppoVar34 = (&poVar8->nmps)[uVar31 < uVar39];
                                    do {
                                      iVar14 = (int)uVar45;
                                      if (OVar29 == 0) {
                                        pOVar9 = (t1->mqc).bp;
                                        bVar19 = pOVar9[1];
                                        if (*pOVar9 == 0xff) {
                                          if (bVar19 < 0x90) {
                                            (t1->mqc).bp = pOVar9 + 1;
                                            iVar14 = iVar14 + (uint)bVar19 * 0x200;
                                            OVar29 = 7;
                                            goto LAB_0012594d;
                                          }
                                          iVar14 = iVar14 + 0xff00;
                                          pOVar1 = &(t1->mqc).end_of_byte_stream_counter;
                                          *pOVar1 = *pOVar1 + 1;
                                        }
                                        else {
                                          (t1->mqc).bp = pOVar9 + 1;
                                          iVar14 = iVar14 + (uint)bVar19 * 0x100;
                                        }
                                        OVar29 = 8;
                                      }
LAB_0012594d:
                                      uVar31 = uVar31 * 2;
                                      uVar45 = (ulong)(uint)(iVar14 * 2);
                                      OVar29 = OVar29 - 1;
                                    } while (uVar31 < 0x8000);
                                  }
                                }
                                uVar39 = uVar25;
                                if (uVar49 == puVar44[0x80] >> 0x1f) {
                                  uVar39 = uVar20;
                                }
                                puVar44[0x80] = uVar39 + puVar44[0x80];
                                uVar43 = uVar43 | 0x4000000;
                              }
                              if ((uVar43 & 0x40002000) == 0x2000) {
                                uVar28 = (ulong)(0xf - ((uVar43 & 0x3de00) == 0));
                                if ((uVar43 >> 0x1d & 1) != 0) {
                                  uVar28 = 0x10;
                                }
                                ppoVar34 = (t1->mqc).ctxs + uVar28;
                                poVar8 = *ppoVar34;
                                uVar39 = poVar8->qeval;
                                uVar31 = uVar31 - uVar39;
                                if ((uint)(uVar45 >> 0x10) < uVar39) {
                                  uVar49 = (uint)(poVar8->mps == 0);
                                  if (uVar39 > uVar31) {
                                    uVar49 = poVar8->mps;
                                  }
                                  *ppoVar34 = (&poVar8->nmps)[uVar39 <= uVar31];
                                  uVar31 = uVar39;
                                  do {
                                    iVar14 = (int)uVar45;
                                    if (OVar29 == 0) {
                                      pOVar9 = (t1->mqc).bp;
                                      bVar19 = pOVar9[1];
                                      if (*pOVar9 == 0xff) {
                                        if (bVar19 < 0x90) {
                                          (t1->mqc).bp = pOVar9 + 1;
                                          iVar14 = iVar14 + (uint)bVar19 * 0x200;
                                          OVar29 = 7;
                                          goto LAB_00125a44;
                                        }
                                        iVar14 = iVar14 + 0xff00;
                                        pOVar1 = &(t1->mqc).end_of_byte_stream_counter;
                                        *pOVar1 = *pOVar1 + 1;
                                      }
                                      else {
                                        (t1->mqc).bp = pOVar9 + 1;
                                        iVar14 = iVar14 + (uint)bVar19 * 0x100;
                                      }
                                      OVar29 = 8;
                                    }
LAB_00125a44:
                                    uVar31 = uVar31 * 2;
                                    uVar45 = (ulong)(uint)(iVar14 * 2);
                                    OVar29 = OVar29 - 1;
                                  } while (uVar31 < 0x8000);
                                }
                                else {
                                  uVar45 = (ulong)((int)uVar45 + uVar39 * -0x10000);
                                  if ((short)uVar31 < 0) {
                                    uVar49 = poVar8->mps;
                                  }
                                  else {
                                    uVar49 = (uint)(poVar8->mps == 0);
                                    if (uVar31 >= uVar39) {
                                      uVar49 = poVar8->mps;
                                    }
                                    *ppoVar34 = (&poVar8->nmps)[uVar31 < uVar39];
                                    do {
                                      iVar14 = (int)uVar45;
                                      if (OVar29 == 0) {
                                        pOVar9 = (t1->mqc).bp;
                                        bVar19 = pOVar9[1];
                                        if (*pOVar9 == 0xff) {
                                          if (bVar19 < 0x90) {
                                            (t1->mqc).bp = pOVar9 + 1;
                                            iVar14 = iVar14 + (uint)bVar19 * 0x200;
                                            OVar29 = 7;
                                            goto LAB_00125acb;
                                          }
                                          iVar14 = iVar14 + 0xff00;
                                          pOVar1 = &(t1->mqc).end_of_byte_stream_counter;
                                          *pOVar1 = *pOVar1 + 1;
                                        }
                                        else {
                                          (t1->mqc).bp = pOVar9 + 1;
                                          iVar14 = iVar14 + (uint)bVar19 * 0x100;
                                        }
                                        OVar29 = 8;
                                      }
LAB_00125acb:
                                      uVar31 = uVar31 * 2;
                                      uVar45 = (ulong)(uint)(iVar14 * 2);
                                      OVar29 = OVar29 - 1;
                                    } while (uVar31 < 0x8000);
                                  }
                                }
                                uVar39 = uVar25;
                                if (uVar49 == puVar44[0xc0] >> 0x1f) {
                                  uVar39 = uVar20;
                                }
                                puVar44[0xc0] = uVar39 + puVar44[0xc0];
                                uVar43 = uVar43 | 0x20000000;
                              }
                              *puVar50 = uVar43;
                            }
                            iVar36 = iVar36 + 1;
                            puVar16 = puVar44 + 1;
                            puVar17 = puVar50 + 1;
                          } while (iVar36 != 0x40);
                          puVar16 = puVar44 + 0xc1;
                          puVar17 = puVar50 + 3;
                          bVar52 = uVar41 < 0x3c;
                          uVar41 = uVar41 + 4;
                        } while (bVar52);
                        (t1->mqc).curctx = ppoVar34;
                        (t1->mqc).c = (OPJ_UINT32)uVar45;
                        (t1->mqc).a = uVar31;
                        (t1->mqc).ct = OVar29;
                      }
                      else {
                        puVar16 = (uint *)t1->data;
                        puVar17 = t1->flags + (uVar31 + 3);
                        ppoVar34 = (t1->mqc).curctx;
                        uVar41 = (t1->mqc).c;
                        uVar28 = (ulong)uVar41;
                        uVar20 = (t1->mqc).a;
                        OVar29 = (t1->mqc).ct;
                        uVar39 = (uint)(1 << (bVar19 & 0x1f)) >> 1;
                        uVar25 = t1->h;
                        uVar43 = 0;
                        if (3 < uVar25) {
                          uVar21 = -uVar39;
                          uVar49 = uVar31 * 3;
                          uVar43 = 0;
                          do {
                            if (uVar45 != 0) {
                              uVar41 = 0;
                              do {
                                uVar25 = *puVar17;
                                if (uVar25 != 0) {
                                  if ((uVar25 & 0x200010) == 0x10) {
                                    uVar40 = 0xf - ((uVar25 & 0x1ef) == 0);
                                    if ((uVar25 >> 0x14 & 1) != 0) {
                                      uVar40 = 0x10;
                                    }
                                    ppoVar34 = (t1->mqc).ctxs + uVar40;
                                    poVar8 = *ppoVar34;
                                    uVar40 = poVar8->qeval;
                                    uVar20 = uVar20 - uVar40;
                                    if ((uint)(uVar28 >> 0x10) < uVar40) {
                                      uVar47 = (uint)(poVar8->mps == 0);
                                      if (uVar40 > uVar20) {
                                        uVar47 = poVar8->mps;
                                      }
                                      *ppoVar34 = (&poVar8->nmps)[uVar40 <= uVar20];
                                      do {
                                        iVar36 = (int)uVar28;
                                        if (OVar29 == 0) {
                                          pOVar9 = (t1->mqc).bp;
                                          bVar19 = pOVar9[1];
                                          if (*pOVar9 == 0xff) {
                                            if (bVar19 < 0x90) {
                                              (t1->mqc).bp = pOVar9 + 1;
                                              iVar36 = iVar36 + (uint)bVar19 * 0x200;
                                              OVar29 = 7;
                                              goto LAB_001262b2;
                                            }
                                            iVar36 = iVar36 + 0xff00;
                                            pOVar1 = &(t1->mqc).end_of_byte_stream_counter;
                                            *pOVar1 = *pOVar1 + 1;
                                          }
                                          else {
                                            (t1->mqc).bp = pOVar9 + 1;
                                            iVar36 = iVar36 + (uint)bVar19 * 0x100;
                                          }
                                          OVar29 = 8;
                                        }
LAB_001262b2:
                                        uVar40 = uVar40 * 2;
                                        uVar28 = (ulong)(uint)(iVar36 * 2);
                                        OVar29 = OVar29 - 1;
                                        uVar20 = uVar40;
                                      } while (uVar40 < 0x8000);
                                    }
                                    else {
                                      uVar28 = (ulong)((int)uVar28 + uVar40 * -0x10000);
                                      if ((short)uVar20 < 0) {
                                        uVar47 = poVar8->mps;
                                      }
                                      else {
                                        uVar47 = (uint)(poVar8->mps == 0);
                                        if (uVar20 >= uVar40) {
                                          uVar47 = poVar8->mps;
                                        }
                                        *ppoVar34 = (&poVar8->nmps)[uVar20 < uVar40];
                                        do {
                                          iVar36 = (int)uVar28;
                                          if (OVar29 == 0) {
                                            pOVar9 = (t1->mqc).bp;
                                            bVar19 = pOVar9[1];
                                            if (*pOVar9 == 0xff) {
                                              if (bVar19 < 0x90) {
                                                (t1->mqc).bp = pOVar9 + 1;
                                                iVar36 = iVar36 + (uint)bVar19 * 0x200;
                                                OVar29 = 7;
                                                goto LAB_0012634b;
                                              }
                                              iVar36 = iVar36 + 0xff00;
                                              pOVar1 = &(t1->mqc).end_of_byte_stream_counter;
                                              *pOVar1 = *pOVar1 + 1;
                                            }
                                            else {
                                              (t1->mqc).bp = pOVar9 + 1;
                                              iVar36 = iVar36 + (uint)bVar19 * 0x100;
                                            }
                                            OVar29 = 8;
                                          }
LAB_0012634b:
                                          uVar20 = uVar20 * 2;
                                          uVar28 = (ulong)(uint)(iVar36 * 2);
                                          OVar29 = OVar29 - 1;
                                        } while (uVar20 < 0x8000);
                                      }
                                    }
                                    uVar40 = uVar39;
                                    if (uVar47 == *puVar16 >> 0x1f) {
                                      uVar40 = uVar21;
                                    }
                                    *puVar16 = uVar40 + *puVar16;
                                    uVar25 = uVar25 | 0x100000;
                                  }
                                  if ((uVar25 & 0x1000080) == 0x80) {
                                    uVar30 = (ulong)(0xf - ((uVar25 & 0xf78) == 0));
                                    if ((uVar25 >> 0x17 & 1) != 0) {
                                      uVar30 = 0x10;
                                    }
                                    ppoVar34 = (t1->mqc).ctxs + uVar30;
                                    poVar8 = *ppoVar34;
                                    uVar40 = poVar8->qeval;
                                    uVar20 = uVar20 - uVar40;
                                    if ((uint)(uVar28 >> 0x10) < uVar40) {
                                      uVar47 = (uint)(poVar8->mps == 0);
                                      if (uVar40 > uVar20) {
                                        uVar47 = poVar8->mps;
                                      }
                                      *ppoVar34 = (&poVar8->nmps)[uVar40 <= uVar20];
                                      do {
                                        iVar36 = (int)uVar28;
                                        if (OVar29 == 0) {
                                          pOVar9 = (t1->mqc).bp;
                                          bVar19 = pOVar9[1];
                                          if (*pOVar9 == 0xff) {
                                            if (bVar19 < 0x90) {
                                              (t1->mqc).bp = pOVar9 + 1;
                                              iVar36 = iVar36 + (uint)bVar19 * 0x200;
                                              OVar29 = 7;
                                              goto LAB_00126454;
                                            }
                                            iVar36 = iVar36 + 0xff00;
                                            pOVar1 = &(t1->mqc).end_of_byte_stream_counter;
                                            *pOVar1 = *pOVar1 + 1;
                                          }
                                          else {
                                            (t1->mqc).bp = pOVar9 + 1;
                                            iVar36 = iVar36 + (uint)bVar19 * 0x100;
                                          }
                                          OVar29 = 8;
                                        }
LAB_00126454:
                                        uVar40 = uVar40 * 2;
                                        uVar28 = (ulong)(uint)(iVar36 * 2);
                                        OVar29 = OVar29 - 1;
                                        uVar20 = uVar40;
                                      } while (uVar40 < 0x8000);
                                    }
                                    else {
                                      uVar28 = (ulong)((int)uVar28 + uVar40 * -0x10000);
                                      if ((short)uVar20 < 0) {
                                        uVar47 = poVar8->mps;
                                      }
                                      else {
                                        uVar47 = (uint)(poVar8->mps == 0);
                                        if (uVar20 >= uVar40) {
                                          uVar47 = poVar8->mps;
                                        }
                                        *ppoVar34 = (&poVar8->nmps)[uVar20 < uVar40];
                                        do {
                                          iVar36 = (int)uVar28;
                                          if (OVar29 == 0) {
                                            pOVar9 = (t1->mqc).bp;
                                            bVar19 = pOVar9[1];
                                            if (*pOVar9 == 0xff) {
                                              if (bVar19 < 0x90) {
                                                (t1->mqc).bp = pOVar9 + 1;
                                                iVar36 = iVar36 + (uint)bVar19 * 0x200;
                                                OVar29 = 7;
                                                goto LAB_001264f2;
                                              }
                                              iVar36 = iVar36 + 0xff00;
                                              pOVar1 = &(t1->mqc).end_of_byte_stream_counter;
                                              *pOVar1 = *pOVar1 + 1;
                                            }
                                            else {
                                              (t1->mqc).bp = pOVar9 + 1;
                                              iVar36 = iVar36 + (uint)bVar19 * 0x100;
                                            }
                                            OVar29 = 8;
                                          }
LAB_001264f2:
                                          uVar20 = uVar20 * 2;
                                          uVar28 = (ulong)(uint)(iVar36 * 2);
                                          OVar29 = OVar29 - 1;
                                        } while (uVar20 < 0x8000);
                                      }
                                    }
                                    uVar40 = uVar39;
                                    if (uVar47 == puVar16[uVar45] >> 0x1f) {
                                      uVar40 = uVar21;
                                    }
                                    puVar16[uVar45] = uVar40 + puVar16[uVar45];
                                    uVar25 = uVar25 | 0x800000;
                                  }
                                  if ((uVar25 & 0x8000400) == 0x400) {
                                    uVar30 = (ulong)(0xf - ((uVar25 & 0x7bc0) == 0));
                                    if ((uVar25 >> 0x1a & 1) != 0) {
                                      uVar30 = 0x10;
                                    }
                                    ppoVar34 = (t1->mqc).ctxs + uVar30;
                                    poVar8 = *ppoVar34;
                                    uVar40 = poVar8->qeval;
                                    uVar20 = uVar20 - uVar40;
                                    if ((uint)(uVar28 >> 0x10) < uVar40) {
                                      uVar47 = (uint)(poVar8->mps == 0);
                                      if (uVar40 > uVar20) {
                                        uVar47 = poVar8->mps;
                                      }
                                      *ppoVar34 = (&poVar8->nmps)[uVar40 <= uVar20];
                                      do {
                                        iVar36 = (int)uVar28;
                                        if (OVar29 == 0) {
                                          pOVar9 = (t1->mqc).bp;
                                          bVar19 = pOVar9[1];
                                          if (*pOVar9 == 0xff) {
                                            if (bVar19 < 0x90) {
                                              (t1->mqc).bp = pOVar9 + 1;
                                              iVar36 = iVar36 + (uint)bVar19 * 0x200;
                                              OVar29 = 7;
                                              goto LAB_001265fd;
                                            }
                                            iVar36 = iVar36 + 0xff00;
                                            pOVar1 = &(t1->mqc).end_of_byte_stream_counter;
                                            *pOVar1 = *pOVar1 + 1;
                                          }
                                          else {
                                            (t1->mqc).bp = pOVar9 + 1;
                                            iVar36 = iVar36 + (uint)bVar19 * 0x100;
                                          }
                                          OVar29 = 8;
                                        }
LAB_001265fd:
                                        uVar40 = uVar40 * 2;
                                        uVar28 = (ulong)(uint)(iVar36 * 2);
                                        OVar29 = OVar29 - 1;
                                        uVar20 = uVar40;
                                      } while (uVar40 < 0x8000);
                                    }
                                    else {
                                      uVar28 = (ulong)((int)uVar28 + uVar40 * -0x10000);
                                      if ((short)uVar20 < 0) {
                                        uVar47 = poVar8->mps;
                                      }
                                      else {
                                        uVar47 = (uint)(poVar8->mps == 0);
                                        if (uVar20 >= uVar40) {
                                          uVar47 = poVar8->mps;
                                        }
                                        *ppoVar34 = (&poVar8->nmps)[uVar20 < uVar40];
                                        do {
                                          iVar36 = (int)uVar28;
                                          if (OVar29 == 0) {
                                            pOVar9 = (t1->mqc).bp;
                                            bVar19 = pOVar9[1];
                                            if (*pOVar9 == 0xff) {
                                              if (bVar19 < 0x90) {
                                                (t1->mqc).bp = pOVar9 + 1;
                                                iVar36 = iVar36 + (uint)bVar19 * 0x200;
                                                OVar29 = 7;
                                                goto LAB_0012669b;
                                              }
                                              iVar36 = iVar36 + 0xff00;
                                              pOVar1 = &(t1->mqc).end_of_byte_stream_counter;
                                              *pOVar1 = *pOVar1 + 1;
                                            }
                                            else {
                                              (t1->mqc).bp = pOVar9 + 1;
                                              iVar36 = iVar36 + (uint)bVar19 * 0x100;
                                            }
                                            OVar29 = 8;
                                          }
LAB_0012669b:
                                          uVar20 = uVar20 * 2;
                                          uVar28 = (ulong)(uint)(iVar36 * 2);
                                          OVar29 = OVar29 - 1;
                                        } while (uVar20 < 0x8000);
                                      }
                                    }
                                    uVar40 = uVar39;
                                    if (uVar47 == puVar16[uVar31 * 2] >> 0x1f) {
                                      uVar40 = uVar21;
                                    }
                                    puVar16[uVar31 * 2] = uVar40 + puVar16[uVar31 * 2];
                                    uVar25 = uVar25 | 0x4000000;
                                  }
                                  if ((uVar25 & 0x40002000) == 0x2000) {
                                    uVar30 = (ulong)(0xf - ((uVar25 & 0x3de00) == 0));
                                    if ((uVar25 >> 0x1d & 1) != 0) {
                                      uVar30 = 0x10;
                                    }
                                    ppoVar34 = (t1->mqc).ctxs + uVar30;
                                    poVar8 = *ppoVar34;
                                    uVar40 = poVar8->qeval;
                                    uVar20 = uVar20 - uVar40;
                                    if ((uint)(uVar28 >> 0x10) < uVar40) {
                                      uVar47 = (uint)(poVar8->mps == 0);
                                      if (uVar40 > uVar20) {
                                        uVar47 = poVar8->mps;
                                      }
                                      *ppoVar34 = (&poVar8->nmps)[uVar40 <= uVar20];
                                      do {
                                        iVar36 = (int)uVar28;
                                        if (OVar29 == 0) {
                                          pOVar9 = (t1->mqc).bp;
                                          bVar19 = pOVar9[1];
                                          if (*pOVar9 == 0xff) {
                                            if (bVar19 < 0x90) {
                                              (t1->mqc).bp = pOVar9 + 1;
                                              iVar36 = iVar36 + (uint)bVar19 * 0x200;
                                              OVar29 = 7;
                                              goto LAB_001267b5;
                                            }
                                            iVar36 = iVar36 + 0xff00;
                                            pOVar1 = &(t1->mqc).end_of_byte_stream_counter;
                                            *pOVar1 = *pOVar1 + 1;
                                          }
                                          else {
                                            (t1->mqc).bp = pOVar9 + 1;
                                            iVar36 = iVar36 + (uint)bVar19 * 0x100;
                                          }
                                          OVar29 = 8;
                                        }
LAB_001267b5:
                                        uVar40 = uVar40 * 2;
                                        uVar28 = (ulong)(uint)(iVar36 * 2);
                                        OVar29 = OVar29 - 1;
                                        uVar20 = uVar40;
                                      } while (uVar40 < 0x8000);
                                    }
                                    else {
                                      uVar28 = (ulong)((int)uVar28 + uVar40 * -0x10000);
                                      if ((short)uVar20 < 0) {
                                        uVar47 = poVar8->mps;
                                      }
                                      else {
                                        uVar47 = (uint)(poVar8->mps == 0);
                                        if (uVar20 >= uVar40) {
                                          uVar47 = poVar8->mps;
                                        }
                                        *ppoVar34 = (&poVar8->nmps)[uVar20 < uVar40];
                                        do {
                                          iVar36 = (int)uVar28;
                                          if (OVar29 == 0) {
                                            pOVar9 = (t1->mqc).bp;
                                            bVar19 = pOVar9[1];
                                            if (*pOVar9 == 0xff) {
                                              if (bVar19 < 0x90) {
                                                (t1->mqc).bp = pOVar9 + 1;
                                                iVar36 = iVar36 + (uint)bVar19 * 0x200;
                                                OVar29 = 7;
                                                goto LAB_00126853;
                                              }
                                              iVar36 = iVar36 + 0xff00;
                                              pOVar1 = &(t1->mqc).end_of_byte_stream_counter;
                                              *pOVar1 = *pOVar1 + 1;
                                            }
                                            else {
                                              (t1->mqc).bp = pOVar9 + 1;
                                              iVar36 = iVar36 + (uint)bVar19 * 0x100;
                                            }
                                            OVar29 = 8;
                                          }
LAB_00126853:
                                          uVar20 = uVar20 * 2;
                                          uVar28 = (ulong)(uint)(iVar36 * 2);
                                          OVar29 = OVar29 - 1;
                                        } while (uVar20 < 0x8000);
                                      }
                                    }
                                    uVar40 = uVar39;
                                    if (uVar47 == puVar16[uVar49] >> 0x1f) {
                                      uVar40 = uVar21;
                                    }
                                    puVar16[uVar49] = uVar40 + puVar16[uVar49];
                                    uVar25 = uVar25 | 0x20000000;
                                  }
                                  *puVar17 = uVar25;
                                }
                                uVar41 = uVar41 + 1;
                                puVar16 = puVar16 + 1;
                                puVar17 = puVar17 + 1;
                              } while (uVar41 != uVar31);
                            }
                            uVar41 = (uint)uVar28;
                            uVar43 = uVar43 + 4;
                            puVar16 = puVar16 + uVar49;
                            puVar17 = puVar17 + 2;
                            uVar25 = t1->h;
                          } while (uVar43 < (uVar25 & 0xfffffffc));
                        }
                        (t1->mqc).curctx = ppoVar34;
                        (t1->mqc).c = uVar41;
                        (t1->mqc).a = uVar20;
                        (t1->mqc).ct = OVar29;
                        if (uVar45 != 0 && uVar43 < uVar25) {
                          uVar41 = 0;
                          do {
                            if (t1->h != uVar43) {
                              uVar45 = 0;
                              do {
                                bVar19 = (char)uVar45 * '\x03';
                                if ((0x200010 << (bVar19 & 0x1f) & *puVar17) ==
                                    0x10 << (bVar19 & 0x1f)) {
                                  uVar20 = *puVar17 >> (bVar19 & 0x1f);
                                  iVar36 = 0xf - (uint)((uVar20 & 0x1ef) == 0);
                                  if ((uVar20 >> 0x14 & 1) != 0) {
                                    iVar36 = 0x10;
                                  }
                                  ppoVar34 = (opj_mqc_state_t **)
                                             ((long)(t1->mqc).ctxs + (ulong)(uint)(iVar36 << 3));
                                  (t1->mqc).curctx = ppoVar34;
                                  puVar44 = *(uint **)((long)(t1->mqc).ctxs +
                                                      (ulong)(uint)(iVar36 << 3));
                                  uVar20 = *puVar44;
                                  uVar25 = (t1->mqc).c;
                                  uVar49 = (t1->mqc).a - uVar20;
                                  (t1->mqc).a = uVar49;
                                  if (uVar25 >> 0x10 < uVar20) {
                                    (t1->mqc).a = uVar20;
                                    uVar21 = (uint)(puVar44[1] == 0);
                                    if (uVar20 > uVar49) {
                                      uVar21 = puVar44[1];
                                    }
                                    *ppoVar34 = *(opj_mqc_state_t **)
                                                 (puVar44 + (ulong)(uVar20 <= uVar49) * 2 + 2);
                                    uVar20 = (t1->mqc).a;
                                    OVar29 = (t1->mqc).ct;
                                    do {
                                      if (OVar29 == 0) {
                                        pOVar9 = (t1->mqc).bp;
                                        bVar4 = pOVar9[1];
                                        if (*pOVar9 == 0xff) {
                                          if (bVar4 < 0x90) {
                                            (t1->mqc).bp = pOVar9 + 1;
                                            uVar25 = uVar25 + (uint)bVar4 * 0x200;
                                            (t1->mqc).c = uVar25;
                                            (t1->mqc).ct = 7;
                                            OVar29 = 7;
                                            goto LAB_00126a41;
                                          }
                                          uVar25 = uVar25 + 0xff00;
                                          (t1->mqc).c = uVar25;
                                          (t1->mqc).ct = 8;
                                          pOVar1 = &(t1->mqc).end_of_byte_stream_counter;
                                          *pOVar1 = *pOVar1 + 1;
                                        }
                                        else {
                                          (t1->mqc).bp = pOVar9 + 1;
                                          uVar25 = uVar25 + (uint)bVar4 * 0x100;
                                          (t1->mqc).c = uVar25;
                                          (t1->mqc).ct = 8;
                                        }
                                        OVar29 = 8;
                                      }
LAB_00126a41:
                                      uVar20 = uVar20 * 2;
                                      (t1->mqc).a = uVar20;
                                      uVar25 = uVar25 * 2;
                                      (t1->mqc).c = uVar25;
                                      OVar29 = OVar29 - 1;
                                      (t1->mqc).ct = OVar29;
                                    } while (uVar20 < 0x8000);
                                  }
                                  else {
                                    OVar29 = uVar25 + uVar20 * -0x10000;
                                    (t1->mqc).c = OVar29;
                                    if ((short)uVar49 < 0) {
                                      uVar21 = puVar44[1];
                                    }
                                    else {
                                      uVar21 = (uint)(puVar44[1] == 0);
                                      if (uVar49 >= uVar20) {
                                        uVar21 = puVar44[1];
                                      }
                                      *ppoVar34 = *(opj_mqc_state_t **)
                                                   (puVar44 + (ulong)(uVar49 < uVar20) * 2 + 2);
                                      OVar37 = (t1->mqc).ct;
                                      do {
                                        if (OVar37 == 0) {
                                          pOVar9 = (t1->mqc).bp;
                                          bVar4 = pOVar9[1];
                                          if (*pOVar9 == 0xff) {
                                            if (bVar4 < 0x90) {
                                              (t1->mqc).bp = pOVar9 + 1;
                                              OVar29 = OVar29 + (uint)bVar4 * 0x200;
                                              (t1->mqc).c = OVar29;
                                              (t1->mqc).ct = 7;
                                              OVar37 = 7;
                                              goto LAB_00126b15;
                                            }
                                            OVar29 = OVar29 + 0xff00;
                                            (t1->mqc).c = OVar29;
                                            (t1->mqc).ct = 8;
                                            pOVar1 = &(t1->mqc).end_of_byte_stream_counter;
                                            *pOVar1 = *pOVar1 + 1;
                                          }
                                          else {
                                            (t1->mqc).bp = pOVar9 + 1;
                                            OVar29 = OVar29 + (uint)bVar4 * 0x100;
                                            (t1->mqc).c = OVar29;
                                            (t1->mqc).ct = 8;
                                          }
                                          OVar37 = 8;
                                        }
LAB_00126b15:
                                        uVar49 = uVar49 * 2;
                                        (t1->mqc).a = uVar49;
                                        OVar29 = OVar29 * 2;
                                        (t1->mqc).c = OVar29;
                                        OVar37 = OVar37 - 1;
                                        (t1->mqc).ct = OVar37;
                                      } while (uVar49 < 0x8000);
                                    }
                                  }
                                  uVar25 = uVar31 * (int)uVar45;
                                  uVar20 = uVar39;
                                  if (uVar21 == puVar16[uVar25] >> 0x1f) {
                                    uVar20 = -uVar39;
                                  }
                                  puVar16[uVar25] = uVar20 + puVar16[uVar25];
                                  *puVar17 = *puVar17 | 0x100000 << (bVar19 & 0x1f);
                                }
                                uVar45 = uVar45 + 1;
                              } while (uVar45 < t1->h - uVar43);
                            }
                            uVar41 = uVar41 + 1;
                            puVar16 = puVar16 + 1;
                            puVar17 = puVar17 + 1;
                          } while (uVar41 != uVar31);
                        }
                      }
                    }
                    else {
                      puVar16 = (uint *)t1->data;
                      uVar31 = t1->w;
                      uVar45 = (ulong)uVar31;
                      puVar17 = t1->flags + (uVar31 + 3);
                      uVar20 = (uint)(1 << (bVar19 & 0x1f)) >> 1;
                      uVar41 = t1->h;
                      uVar25 = 0;
                      if (3 < uVar41) {
                        uVar49 = -uVar20;
                        uVar43 = uVar31 * 3;
                        uVar25 = 0;
                        uVar28 = uVar45;
                        uVar39 = uVar31;
                        do {
                          while (uVar39 != 0) {
                            if (*puVar17 != 0) {
                              if ((*puVar17 & 0x200010) == 0x10) {
                                if ((t1->mqc).ct == 0) {
                                  pbVar10 = (t1->mqc).bp;
                                  bVar19 = *pbVar10;
                                  if ((t1->mqc).c == 0xff) {
                                    if (0x8f < bVar19) {
                                      (t1->mqc).c = 0xff;
                                      goto LAB_00125c35;
                                    }
                                    (t1->mqc).c = (uint)bVar19;
                                    (t1->mqc).bp = pbVar10 + 1;
                                    OVar29 = 7;
                                  }
                                  else {
                                    (t1->mqc).c = (uint)bVar19;
                                    (t1->mqc).bp = pbVar10 + 1;
LAB_00125c35:
                                    OVar29 = 8;
                                  }
                                  (t1->mqc).ct = OVar29;
                                }
                                uVar39 = (t1->mqc).ct - 1;
                                (t1->mqc).ct = uVar39;
                                uVar41 = uVar20;
                                if ((uint)(((t1->mqc).c >> (uVar39 & 0x1f) & 1) != 0) ==
                                    *puVar16 >> 0x1f) {
                                  uVar41 = uVar49;
                                }
                                *puVar16 = uVar41 + *puVar16;
                                *(byte *)((long)puVar17 + 2) = *(byte *)((long)puVar17 + 2) | 0x10;
                              }
                              if ((*puVar17 & 0x1000080) == 0x80) {
                                if ((t1->mqc).ct == 0) {
                                  pbVar10 = (t1->mqc).bp;
                                  bVar19 = *pbVar10;
                                  if ((t1->mqc).c == 0xff) {
                                    if (0x8f < bVar19) {
                                      (t1->mqc).c = 0xff;
                                      goto LAB_00125cbd;
                                    }
                                    (t1->mqc).c = (uint)bVar19;
                                    (t1->mqc).bp = pbVar10 + 1;
                                    OVar29 = 7;
                                  }
                                  else {
                                    (t1->mqc).c = (uint)bVar19;
                                    (t1->mqc).bp = pbVar10 + 1;
LAB_00125cbd:
                                    OVar29 = 8;
                                  }
                                  (t1->mqc).ct = OVar29;
                                }
                                uVar39 = (t1->mqc).ct - 1;
                                (t1->mqc).ct = uVar39;
                                uVar41 = uVar20;
                                if ((uint)(((t1->mqc).c >> (uVar39 & 0x1f) & 1) != 0) ==
                                    puVar16[uVar45] >> 0x1f) {
                                  uVar41 = uVar49;
                                }
                                puVar16[uVar45] = uVar41 + puVar16[uVar45];
                                *(byte *)((long)puVar17 + 2) = *(byte *)((long)puVar17 + 2) | 0x80;
                              }
                              if ((*puVar17 & 0x8000400) == 0x400) {
                                if ((t1->mqc).ct == 0) {
                                  pbVar10 = (t1->mqc).bp;
                                  bVar19 = *pbVar10;
                                  if ((t1->mqc).c == 0xff) {
                                    if (0x8f < bVar19) {
                                      (t1->mqc).c = 0xff;
                                      goto LAB_00125d4b;
                                    }
                                    (t1->mqc).c = (uint)bVar19;
                                    (t1->mqc).bp = pbVar10 + 1;
                                    OVar29 = 7;
                                  }
                                  else {
                                    (t1->mqc).c = (uint)bVar19;
                                    (t1->mqc).bp = pbVar10 + 1;
LAB_00125d4b:
                                    OVar29 = 8;
                                  }
                                  (t1->mqc).ct = OVar29;
                                }
                                uVar39 = (t1->mqc).ct - 1;
                                (t1->mqc).ct = uVar39;
                                uVar41 = uVar20;
                                if ((uint)(((t1->mqc).c >> (uVar39 & 0x1f) & 1) != 0) ==
                                    puVar16[uVar31 * 2] >> 0x1f) {
                                  uVar41 = uVar49;
                                }
                                puVar16[uVar31 * 2] = uVar41 + puVar16[uVar31 * 2];
                                *(byte *)((long)puVar17 + 3) = *(byte *)((long)puVar17 + 3) | 4;
                              }
                              if ((*puVar17 & 0x40002000) == 0x2000) {
                                if ((t1->mqc).ct == 0) {
                                  pbVar10 = (t1->mqc).bp;
                                  bVar19 = *pbVar10;
                                  if ((t1->mqc).c == 0xff) {
                                    if (0x8f < bVar19) {
                                      (t1->mqc).c = 0xff;
                                      goto LAB_00125ddb;
                                    }
                                    (t1->mqc).c = (uint)bVar19;
                                    (t1->mqc).bp = pbVar10 + 1;
                                    OVar29 = 7;
                                  }
                                  else {
                                    (t1->mqc).c = (uint)bVar19;
                                    (t1->mqc).bp = pbVar10 + 1;
LAB_00125ddb:
                                    OVar29 = 8;
                                  }
                                  (t1->mqc).ct = OVar29;
                                }
                                uVar39 = (t1->mqc).ct - 1;
                                (t1->mqc).ct = uVar39;
                                uVar41 = uVar20;
                                if ((uint)(((t1->mqc).c >> (uVar39 & 0x1f) & 1) != 0) ==
                                    puVar16[uVar43] >> 0x1f) {
                                  uVar41 = uVar49;
                                }
                                puVar16[uVar43] = uVar41 + puVar16[uVar43];
                                *(byte *)((long)puVar17 + 3) = *(byte *)((long)puVar17 + 3) | 0x20;
                              }
                            }
                            puVar17 = puVar17 + 1;
                            puVar16 = puVar16 + 1;
                            uVar39 = (int)uVar28 - 1;
                            uVar28 = (ulong)uVar39;
                          }
                          uVar25 = uVar25 + 4;
                          puVar17 = puVar17 + 2;
                          puVar16 = puVar16 + uVar43;
                          uVar41 = t1->h;
                          uVar28 = uVar45;
                          uVar39 = uVar31;
                        } while (uVar25 < (uVar41 & 0xfffffffc));
                      }
                      if (uVar31 != 0 && uVar25 < uVar41) {
                        uVar41 = 0;
                        do {
                          if (t1->h != uVar25) {
                            uVar28 = 0;
                            bVar19 = 0;
                            uVar45 = 0;
                            do {
                              if ((0x200010 << (bVar19 & 0x1f) & *puVar17) ==
                                  0x10 << (bVar19 & 0x1f)) {
                                if ((t1->mqc).ct == 0) {
                                  pbVar10 = (t1->mqc).bp;
                                  bVar4 = *pbVar10;
                                  if ((t1->mqc).c == 0xff) {
                                    if (0x8f < bVar4) {
                                      (t1->mqc).c = 0xff;
                                      goto LAB_00125ee2;
                                    }
                                    (t1->mqc).c = (uint)bVar4;
                                    (t1->mqc).bp = pbVar10 + 1;
                                    OVar29 = 7;
                                  }
                                  else {
                                    (t1->mqc).c = (uint)bVar4;
                                    (t1->mqc).bp = pbVar10 + 1;
LAB_00125ee2:
                                    OVar29 = 8;
                                  }
                                  (t1->mqc).ct = OVar29;
                                }
                                uVar39 = (t1->mqc).ct - 1;
                                (t1->mqc).ct = uVar39;
                                uVar43 = uVar20;
                                if ((uint)(((t1->mqc).c >> (uVar39 & 0x1f) & 1) != 0) ==
                                    puVar16[uVar28] >> 0x1f) {
                                  uVar43 = -uVar20;
                                }
                                puVar16[uVar28] = uVar43 + puVar16[uVar28];
                                *puVar17 = *puVar17 | 0x100000 << (bVar19 & 0x1f);
                              }
                              uVar45 = uVar45 + 1;
                              bVar19 = bVar19 + 3;
                              uVar28 = (ulong)((int)uVar28 + uVar31);
                            } while (uVar45 < t1->h - uVar25);
                          }
                          uVar41 = uVar41 + 1;
                          puVar17 = puVar17 + 1;
                          puVar16 = puVar16 + 1;
                        } while (uVar41 != uVar31);
                      }
                    }
                  }
                  else if ((bVar51 || bVar53) || bVar12) {
                    opj_t1_dec_sigpass_mqc(t1,local_ec,uVar27);
                  }
                  else {
                    datap = t1->data;
                    uVar31 = t1->w;
                    uVar45 = (ulong)uVar31;
                    flagsp = t1->flags + (uVar31 + 3);
                    uVar25 = (uint)(1 << (bVar19 & 0x1f)) >> 1 | 1 << (local_ec & 0x1f);
                    uVar41 = t1->h;
                    uVar20 = 0;
                    if (3 < uVar41) {
                      uVar20 = 0;
                      uVar28 = uVar45;
                      uVar43 = uVar31;
                      do {
                        while (uVar43 != 0) {
                          if (*flagsp != 0) {
                            opj_t1_dec_sigpass_step_raw(t1,flagsp,datap,uVar25,uVar27 & 8,0);
                            opj_t1_dec_sigpass_step_raw(t1,flagsp,datap + uVar45,uVar25,0,1);
                            opj_t1_dec_sigpass_step_raw(t1,flagsp,datap + uVar31 * 2,uVar25,0,2);
                            opj_t1_dec_sigpass_step_raw(t1,flagsp,datap + uVar31 * 3,uVar25,0,3);
                          }
                          flagsp = flagsp + 1;
                          datap = datap + 1;
                          uVar43 = (int)uVar28 - 1;
                          uVar28 = (ulong)uVar43;
                        }
                        uVar20 = uVar20 + 4;
                        flagsp = flagsp + 2;
                        datap = datap + uVar31 * 3;
                        uVar41 = t1->h;
                        uVar28 = uVar45;
                        uVar43 = uVar31;
                      } while (uVar20 < (uVar41 & 0xfffffffc));
                    }
                    if (uVar31 != 0 && uVar20 < uVar41) {
                      uVar41 = 0;
                      do {
                        if (t1->h != uVar20) {
                          uVar28 = 0;
                          uVar45 = 0;
                          do {
                            opj_t1_dec_sigpass_step_raw
                                      (t1,flagsp,datap + uVar28,uVar25,uVar27 & 8,(OPJ_UINT32)uVar45
                                      );
                            uVar45 = uVar45 + 1;
                            uVar28 = (ulong)((int)uVar28 + uVar31);
                          } while (uVar45 < t1->h - uVar20);
                        }
                        uVar41 = uVar41 + 1;
                        flagsp = flagsp + 1;
                        datap = datap + 1;
                      } while (uVar41 != uVar31);
                    }
                  }
                }
                if (((byte)uVar27 >> 1 & ((bVar51 || bVar53) || bVar12)) != 0) {
                  opj_mqc_resetstates(&t1->mqc);
                  opj_mqc_setstate(&t1->mqc,0x12,0,0x2e);
                  opj_mqc_setstate(&t1->mqc,0x11,0,3);
                  opj_mqc_setstate(&t1->mqc,0,0,4);
                }
                uVar31 = uVar48 + 1;
                uVar48 = uVar31;
                if (uVar31 == 3) {
                  uVar48 = 0;
                }
                local_ec = local_ec - (uVar31 == 3);
                uVar26 = uVar26 + 1;
              } while ((uVar26 < (uint)piVar2[2]) && (0 < (int)local_ec));
            }
            opq_mqc_finish_dec(&t1->mqc);
            uVar46 = uVar46 + 1;
          } while (uVar46 < *(uint *)(plVar6 + 6));
        }
        if (iVar38 != 0) {
          if ((t1->mqc).bp + 2 < (t1->mqc).end) {
            if (mutex != (opj_mutex_t *)0x0) {
              opj_mutex_lock(mutex);
            }
            iVar36 = *(int *)&(t1->mqc).end;
            iVar38 = *(int *)&(t1->mqc).bp;
            iVar14 = *(int *)&(t1->mqc).start;
            opj_event_msg(p_event_mgr,2,
                          "PTERM check failure: %d remaining bytes in code block (%d used / %d)\n",
                          (ulong)((iVar36 - iVar38) - 2),(ulong)(uint)(iVar38 - iVar14),
                          (ulong)(uint)(iVar36 - iVar14));
            if (mutex != (opj_mutex_t *)0x0) {
              opj_mutex_unlock(mutex);
            }
          }
          else if (2 < (t1->mqc).end_of_byte_stream_counter) {
            if (mutex == (opj_mutex_t *)0x0) {
              opj_event_msg(p_event_mgr,2,"PTERM check failure: %d synthetized 0xFF markers read\n")
              ;
            }
            else {
              opj_mutex_lock(mutex);
              opj_event_msg(p_event_mgr,2,"PTERM check failure: %d synthetized 0xFF markers read\n",
                            (ulong)(t1->mqc).end_of_byte_stream_counter);
              opj_mutex_unlock(mutex);
            }
          }
        }
        if (plVar6[8] != 0) {
          t1->data = local_68;
        }
      }
      iVar36 = (int)plVar6[2] - *piVar7;
      if ((piVar7[4] & 1U) != 0) {
        lVar23 = (ulong)(iVar5 - 1) * 0xc0;
        iVar36 = (iVar36 + *(int *)(*(long *)(lVar24 + 0x20) + 8 + lVar23)) -
                 *(int *)(*(long *)(lVar24 + 0x20) + lVar23);
      }
      iVar38 = *(int *)((long)plVar6 + 0x14) - piVar7[1];
      if ((piVar7[4] & 2U) != 0) {
        lVar23 = (ulong)(iVar5 - 1) * 0xc0;
        iVar38 = (iVar38 + *(int *)(*(long *)(lVar24 + 0x20) + 0xc + lVar23)) -
                 *(int *)(*(long *)(lVar24 + 0x20) + 4 + lVar23);
      }
      pfVar11 = (float *)plVar6[8];
      pfVar18 = pfVar11;
      if (pfVar11 == (float *)0x0) {
        pfVar18 = (float *)t1->data;
      }
      uVar27 = t1->w;
      uVar46 = (ulong)uVar27;
      uVar48 = t1->h;
      uVar45 = (ulong)uVar48;
      iVar5 = *(int *)(lVar35 + 0x328);
      if (iVar5 != 0) {
        if (iVar5 < 0x1f) {
          if (uVar45 != 0) {
            uVar26 = 0;
            uVar41 = 0;
            uVar28 = uVar46;
            uVar31 = uVar26;
            do {
              for (; uVar28 != 0; uVar28 = uVar28 - 1) {
                fVar3 = pfVar18[uVar26];
                fVar32 = (float)-(int)fVar3;
                if (0 < (int)fVar3) {
                  fVar32 = fVar3;
                }
                if (1 << ((byte)iVar5 & 0x1f) <= (int)fVar32) {
                  fVar32 = (float)((uint)fVar32 >> (*(byte *)(lVar35 + 0x328) & 0x1f));
                  fVar22 = (float)-(int)fVar32;
                  if (-1 < (int)fVar3) {
                    fVar22 = fVar32;
                  }
                  pfVar18[uVar26] = fVar22;
                }
                uVar26 = uVar26 + 1;
              }
              uVar41 = uVar41 + 1;
              uVar26 = uVar31 + uVar27;
              uVar28 = uVar46;
              uVar31 = uVar26;
            } while (uVar41 != uVar48);
          }
        }
        else if (uVar45 != 0) {
          uVar26 = 0;
          uVar41 = 0;
          uVar28 = uVar46;
          uVar31 = uVar26;
          do {
            for (; uVar28 != 0; uVar28 = uVar28 - 1) {
              pfVar18[uVar26] = 0.0;
              uVar26 = uVar26 + 1;
            }
            uVar41 = uVar41 + 1;
            uVar26 = uVar31 + uVar27;
            uVar28 = uVar46;
            uVar31 = uVar26;
          } while (uVar41 != uVar48);
        }
      }
      if (pfVar11 == (float *)0x0) {
        if (*(long *)(lVar24 + 0x30) == 0) {
          __assert_fail("(cblk->decoded_data != NULL) || (tilec->data != NULL)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/ElMostafaIdrassi[P]OpenJPEGJNI/src/lib/openjp2/t1.c"
                        ,0x6b7,"void opj_t1_clbl_decode_processor(void *, opj_tls_t *)");
        }
        if (*(int *)(lVar35 + 0x14) == 1) {
          if (uVar45 != 0) {
            lVar23 = (long)iVar38 * (ulong)uVar33;
            lVar35 = *(long *)(lVar24 + 0x30) + lVar23 * 4 + (long)iVar36 * 4;
            lVar23 = *(long *)(lVar24 + 0x30) + (long)iVar36 * 4 + lVar23 * 4 + 0xc;
            lVar24 = (ulong)uVar33 * 4;
            lVar42 = 0;
            uVar28 = 0;
            do {
              uVar30 = 0;
              iVar5 = (int)lVar42;
              if ((uVar27 & 0xfffffffc) != 0) {
                uVar30 = 0;
                do {
                  iVar36 = (int)uVar30;
                  fVar3 = pfVar18[iVar5 + iVar36 + 1];
                  fVar32 = pfVar18[(uint)(iVar5 + 2 + iVar36)];
                  fVar22 = pfVar18[iVar5 + iVar36 + 3];
                  *(int *)(lVar23 + -0xc + uVar30 * 4) = (int)pfVar18[(uint)(iVar5 + iVar36)] / 2;
                  *(int *)(lVar23 + -8 + uVar30 * 4) = (int)fVar3 / 2;
                  *(int *)(lVar23 + -4 + uVar30 * 4) = (int)fVar32 / 2;
                  *(int *)(lVar23 + uVar30 * 4) = (int)fVar22 / 2;
                  uVar30 = uVar30 + 4;
                } while (uVar30 < (uVar27 & 0xfffffffc));
              }
              if ((uint)uVar30 < uVar27) {
                uVar30 = uVar30 & 0xffffffff;
                do {
                  *(int *)(lVar35 + uVar30 * 4) = (int)pfVar18[(uint)(iVar5 + (int)uVar30)] / 2;
                  uVar30 = uVar30 + 1;
                } while (uVar46 != uVar30);
              }
              uVar28 = uVar28 + 1;
              lVar23 = lVar23 + lVar24;
              lVar42 = lVar42 + uVar46;
              lVar35 = lVar35 + lVar24;
            } while (uVar28 != uVar45);
          }
        }
        else if (uVar45 != 0) {
          lVar24 = (long)iVar38 * (ulong)uVar33 * 4 + *(long *)(lVar24 + 0x30) + (long)iVar36 * 4;
          uVar26 = 0;
          do {
            if (uVar46 != 0) {
              lVar35 = 0;
              do {
                *(float *)(lVar24 + lVar35 * 4) = (float)(int)*pfVar18 * (float)piVar7[10];
                pfVar18 = pfVar18 + 1;
                lVar35 = lVar35 + 1;
              } while (uVar27 != (uint)lVar35);
            }
            uVar26 = uVar26 + 1;
            lVar24 = lVar24 + (ulong)uVar33 * 4;
          } while (uVar26 != uVar48);
        }
      }
      else {
        uVar27 = uVar27 * uVar48;
        if (*(int *)(lVar35 + 0x14) == 1) {
          if (uVar27 != 0) {
            uVar46 = 0;
            do {
              pfVar18[uVar46] = (float)((int)pfVar18[uVar46] / 2);
              uVar46 = uVar46 + 1;
            } while (uVar27 != uVar46);
          }
        }
        else {
          uVar33 = uVar27 & 0xfffffff0;
          if (uVar33 == 0) {
            uVar33 = 0;
          }
          else {
            fVar3 = (float)piVar7[10];
            uVar48 = 0;
            do {
              *pfVar18 = (float)(int)*pfVar18 * fVar3;
              pfVar18[1] = (float)(int)pfVar18[1] * fVar3;
              pfVar18[2] = (float)(int)pfVar18[2] * fVar3;
              pfVar18[3] = (float)(int)pfVar18[3] * fVar3;
              pfVar18[4] = (float)(int)pfVar18[4] * fVar3;
              pfVar18[5] = (float)(int)pfVar18[5] * fVar3;
              pfVar18[6] = (float)(int)pfVar18[6] * fVar3;
              pfVar18[7] = (float)(int)pfVar18[7] * fVar3;
              pfVar18[8] = (float)(int)pfVar18[8] * fVar3;
              pfVar18[9] = (float)(int)pfVar18[9] * fVar3;
              pfVar18[10] = (float)(int)pfVar18[10] * fVar3;
              pfVar18[0xb] = (float)(int)pfVar18[0xb] * fVar3;
              pfVar18[0xc] = (float)(int)pfVar18[0xc] * fVar3;
              pfVar18[0xd] = (float)(int)pfVar18[0xd] * fVar3;
              pfVar18[0xe] = (float)(int)pfVar18[0xe] * fVar3;
              pfVar18[0xf] = (float)(int)pfVar18[0xf] * fVar3;
              pfVar18 = pfVar18 + 0x10;
              uVar48 = uVar48 + 0x10;
            } while (uVar48 < uVar33);
          }
          if (uVar33 <= uVar27 && uVar27 - uVar33 != 0) {
            lVar24 = 0;
            do {
              pfVar18[lVar24] = (float)(int)pfVar18[lVar24] * (float)piVar7[10];
              lVar24 = lVar24 + 1;
            } while (uVar27 - uVar33 != (int)lVar24);
          }
        }
      }
      goto LAB_00125372;
    }
    if (mutex == (opj_mutex_t *)0x0) {
      opj_event_msg(p_event_mgr,2,"opj_t1_decode_cblk(): unsupported bpno_plus_one = %d >= 31\n",
                    (ulong)local_ec);
    }
    else {
      opj_mutex_lock(mutex);
      opj_event_msg(p_event_mgr,2,"opj_t1_decode_cblk(): unsupported bpno_plus_one = %d >= 31\n",
                    (ulong)local_ec);
      opj_mutex_unlock(mutex);
    }
  }
LAB_00125364:
  **(undefined4 **)((long)user_data + 0x30) = 0;
LAB_00125372:
  opj_free(user_data);
  return;
}

Assistant:

static void opj_t1_clbl_decode_processor(void* user_data, opj_tls_t* tls)
{
    opj_tcd_cblk_dec_t* cblk;
    opj_tcd_band_t* band;
    opj_tcd_tilecomp_t* tilec;
    opj_tccp_t* tccp;
    OPJ_INT32* OPJ_RESTRICT datap;
    OPJ_UINT32 cblk_w, cblk_h;
    OPJ_INT32 x, y;
    OPJ_UINT32 i, j;
    opj_t1_cblk_decode_processing_job_t* job;
    opj_t1_t* t1;
    OPJ_UINT32 resno;
    OPJ_UINT32 tile_w;

    job = (opj_t1_cblk_decode_processing_job_t*) user_data;

    cblk = job->cblk;

    if (!job->whole_tile_decoding) {
        cblk_w = (OPJ_UINT32)(cblk->x1 - cblk->x0);
        cblk_h = (OPJ_UINT32)(cblk->y1 - cblk->y0);

        cblk->decoded_data = (OPJ_INT32*)opj_aligned_malloc(sizeof(OPJ_INT32) *
                             cblk_w * cblk_h);
        if (cblk->decoded_data == NULL) {
            if (job->p_manager_mutex) {
                opj_mutex_lock(job->p_manager_mutex);
            }
            opj_event_msg(job->p_manager, EVT_ERROR,
                          "Cannot allocate cblk->decoded_data\n");
            if (job->p_manager_mutex) {
                opj_mutex_unlock(job->p_manager_mutex);
            }
            *(job->pret) = OPJ_FALSE;
            opj_free(job);
            return;
        }
        /* Zero-init required */
        memset(cblk->decoded_data, 0, sizeof(OPJ_INT32) * cblk_w * cblk_h);
    } else if (cblk->decoded_data) {
        /* Not sure if that code path can happen, but better be */
        /* safe than sorry */
        opj_aligned_free(cblk->decoded_data);
        cblk->decoded_data = NULL;
    }

    resno = job->resno;
    band = job->band;
    tilec = job->tilec;
    tccp = job->tccp;
    tile_w = (OPJ_UINT32)(tilec->resolutions[tilec->minimum_num_resolutions - 1].x1
                          -
                          tilec->resolutions[tilec->minimum_num_resolutions - 1].x0);

    if (!*(job->pret)) {
        opj_free(job);
        return;
    }

    t1 = (opj_t1_t*) opj_tls_get(tls, OPJ_TLS_KEY_T1);
    if (t1 == NULL) {
        t1 = opj_t1_create(OPJ_FALSE);
        opj_tls_set(tls, OPJ_TLS_KEY_T1, t1, opj_t1_destroy_wrapper);
    }
    t1->mustuse_cblkdatabuffer = job->mustuse_cblkdatabuffer;

    if (OPJ_FALSE == opj_t1_decode_cblk(
                t1,
                cblk,
                band->bandno,
                (OPJ_UINT32)tccp->roishift,
                tccp->cblksty,
                job->p_manager,
                job->p_manager_mutex,
                job->check_pterm)) {
        *(job->pret) = OPJ_FALSE;
        opj_free(job);
        return;
    }

    x = cblk->x0 - band->x0;
    y = cblk->y0 - band->y0;
    if (band->bandno & 1) {
        opj_tcd_resolution_t* pres = &tilec->resolutions[resno - 1];
        x += pres->x1 - pres->x0;
    }
    if (band->bandno & 2) {
        opj_tcd_resolution_t* pres = &tilec->resolutions[resno - 1];
        y += pres->y1 - pres->y0;
    }

    datap = cblk->decoded_data ? cblk->decoded_data : t1->data;
    cblk_w = t1->w;
    cblk_h = t1->h;

    if (tccp->roishift) {
        if (tccp->roishift >= 31) {
            for (j = 0; j < cblk_h; ++j) {
                for (i = 0; i < cblk_w; ++i) {
                    datap[(j * cblk_w) + i] = 0;
                }
            }
        } else {
            OPJ_INT32 thresh = 1 << tccp->roishift;
            for (j = 0; j < cblk_h; ++j) {
                for (i = 0; i < cblk_w; ++i) {
                    OPJ_INT32 val = datap[(j * cblk_w) + i];
                    OPJ_INT32 mag = abs(val);
                    if (mag >= thresh) {
                        mag >>= tccp->roishift;
                        datap[(j * cblk_w) + i] = val < 0 ? -mag : mag;
                    }
                }
            }
        }
    }

    /* Both can be non NULL if for example decoding a full tile and then */
    /* partially a tile. In which case partial decoding should be the */
    /* priority */
    assert((cblk->decoded_data != NULL) || (tilec->data != NULL));

    if (cblk->decoded_data) {
        OPJ_UINT32 cblk_size = cblk_w * cblk_h;
        if (tccp->qmfbid == 1) {
            for (i = 0; i < cblk_size; ++i) {
                datap[i] /= 2;
            }
        } else {        /* if (tccp->qmfbid == 0) */
            i = 0;
#ifdef __SSE2__
            {
                const __m128 xmm_stepsize = _mm_set1_ps(band->stepsize);
                for (; i < (cblk_size & ~15U); i += 16) {
                    __m128 xmm0_data = _mm_cvtepi32_ps(_mm_load_si128((__m128i * const)(
                                                           datap + 0)));
                    __m128 xmm1_data = _mm_cvtepi32_ps(_mm_load_si128((__m128i * const)(
                                                           datap + 4)));
                    __m128 xmm2_data = _mm_cvtepi32_ps(_mm_load_si128((__m128i * const)(
                                                           datap + 8)));
                    __m128 xmm3_data = _mm_cvtepi32_ps(_mm_load_si128((__m128i * const)(
                                                           datap + 12)));
                    _mm_store_ps((float*)(datap +  0), _mm_mul_ps(xmm0_data, xmm_stepsize));
                    _mm_store_ps((float*)(datap +  4), _mm_mul_ps(xmm1_data, xmm_stepsize));
                    _mm_store_ps((float*)(datap +  8), _mm_mul_ps(xmm2_data, xmm_stepsize));
                    _mm_store_ps((float*)(datap + 12), _mm_mul_ps(xmm3_data, xmm_stepsize));
                    datap += 16;
                }
            }
#endif
            for (; i < cblk_size; ++i) {
                OPJ_FLOAT32 tmp = ((OPJ_FLOAT32)(*datap)) * band->stepsize;
                memcpy(datap, &tmp, sizeof(tmp));
                datap++;
            }
        }
    } else if (tccp->qmfbid == 1) {
        OPJ_INT32* OPJ_RESTRICT tiledp = &tilec->data[(OPJ_SIZE_T)y * tile_w +
                                                       (OPJ_SIZE_T)x];
        for (j = 0; j < cblk_h; ++j) {
            i = 0;
            for (; i < (cblk_w & ~(OPJ_UINT32)3U); i += 4U) {
                OPJ_INT32 tmp0 = datap[(j * cblk_w) + i + 0U];
                OPJ_INT32 tmp1 = datap[(j * cblk_w) + i + 1U];
                OPJ_INT32 tmp2 = datap[(j * cblk_w) + i + 2U];
                OPJ_INT32 tmp3 = datap[(j * cblk_w) + i + 3U];
                ((OPJ_INT32*)tiledp)[(j * (OPJ_SIZE_T)tile_w) + i + 0U] = tmp0 / 2;
                ((OPJ_INT32*)tiledp)[(j * (OPJ_SIZE_T)tile_w) + i + 1U] = tmp1 / 2;
                ((OPJ_INT32*)tiledp)[(j * (OPJ_SIZE_T)tile_w) + i + 2U] = tmp2 / 2;
                ((OPJ_INT32*)tiledp)[(j * (OPJ_SIZE_T)tile_w) + i + 3U] = tmp3 / 2;
            }
            for (; i < cblk_w; ++i) {
                OPJ_INT32 tmp = datap[(j * cblk_w) + i];
                ((OPJ_INT32*)tiledp)[(j * (OPJ_SIZE_T)tile_w) + i] = tmp / 2;
            }
        }
    } else {        /* if (tccp->qmfbid == 0) */
        OPJ_FLOAT32* OPJ_RESTRICT tiledp = (OPJ_FLOAT32*) &tilec->data[(OPJ_SIZE_T)y *
                                                         tile_w + (OPJ_SIZE_T)x];
        for (j = 0; j < cblk_h; ++j) {
            OPJ_FLOAT32* OPJ_RESTRICT tiledp2 = tiledp;
            for (i = 0; i < cblk_w; ++i) {
                OPJ_FLOAT32 tmp = (OPJ_FLOAT32) * datap * band->stepsize;
                *tiledp2 = tmp;
                datap++;
                tiledp2++;
            }
            tiledp += tile_w;
        }
    }

    opj_free(job);
}